

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  ulong uVar2;
  LogMessage *other;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  undefined4 local_60;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->inlined_ & 1U) != 0) {
    FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGenerator).descriptor_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      local_60 = 1;
      goto LAB_0059d460;
    }
  }
  local_99 = 0;
  if ((this->inlined_ & 1U) != 0) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_string_field.cc"
               ,0x1b8);
    local_99 = 1;
    other = internal::LogMessage::operator<<(&local_98,"CHECK failed: !inlined_: ");
    internal::LogFinisher::operator=(&local_9a,other);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  Formatter::operator()<>((Formatter *)local_50,"$name$_.UnsafeSetDefault($init_value$);\n");
  bVar1 = IsString((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_);
  if (bVar1) {
    FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGenerator).descriptor_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
                );
    }
  }
  local_60 = 0;
LAB_0059d460:
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateConstructorCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (inlined_ && descriptor_->default_value_string().empty()) {
    // Automatic initialization will construct the string.
    return;
  }
  GOOGLE_DCHECK(!inlined_);
  format("$name$_.UnsafeSetDefault($init_value$);\n");
  if (IsString(descriptor_, options_) &&
      descriptor_->default_value_string().empty()) {
    format(
        "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
        "  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n"
        "#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n");
  }
}